

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O3

bool YAML::convert<bool>::decode(Node *node,bool *rhs)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  string *psVar7;
  InvalidNode *this;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  string rest;
  char *local_58;
  ulong local_50;
  char local_48 [16];
  bool *local_38;
  
  bVar5 = Node::IsScalar(node);
  if (!bVar5) {
    return false;
  }
  if ((decode(YAML::Node_const&,bool&)::names == '\0') &&
     (iVar6 = __cxa_guard_acquire(&decode(YAML::Node_const&,bool&)::names), iVar6 != 0)) {
    decode::names[0].truename._M_dataplus._M_p = (pointer)&decode::names[0].truename.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)decode::names,"y","");
    decode::names[0].falsename._M_dataplus._M_p = (pointer)&decode::names[0].falsename.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&decode::names[0].falsename,"n","");
    decode::names[1].truename._M_dataplus._M_p = (pointer)&decode::names[1].truename.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(decode::names + 1),"yes","");
    decode::names[1].falsename._M_dataplus._M_p = (pointer)&decode::names[1].falsename.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&decode::names[1].falsename,"no","");
    decode::names[2].truename._M_dataplus._M_p = (pointer)&decode::names[2].truename.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(decode::names + 2),"true","");
    decode::names[2].falsename._M_dataplus._M_p = (pointer)&decode::names[2].falsename.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&decode::names[2].falsename,"false","");
    decode::names[3].truename._M_dataplus._M_p = (pointer)&decode::names[3].truename.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(decode::names + 3),"on","");
    decode::names[3].falsename._M_dataplus._M_p = (pointer)&decode::names[3].falsename.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&decode::names[3].falsename,"off","");
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&decode(YAML::Node_const&,bool&)::names);
  }
  if (node->m_isValid == false) {
    this = (InvalidNode *)__cxa_allocate_exception(0x40);
    InvalidNode::InvalidNode(this,&node->m_invalidKey);
LAB_00705366:
    __cxa_throw(this,&InvalidNode::typeinfo,BadFile::~BadFile);
  }
  if (node->m_pNode == (node *)0x0) {
    psVar7 = detail::node_data::empty_scalar_abi_cxx11_();
  }
  else {
    psVar7 = &((((node->m_pNode->m_pRef).
                 super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->m_scalar;
  }
  uVar3 = psVar7->_M_string_length;
  if (uVar3 == 0) goto LAB_007051e6;
  pcVar9 = (psVar7->_M_dataplus)._M_p;
  pcVar1 = pcVar9 + uVar3;
  pcVar8 = pcVar9;
  if (0 < (long)uVar3 >> 2) {
    pcVar8 = pcVar9 + (uVar3 & 0xfffffffffffffffc);
    lVar11 = ((long)uVar3 >> 2) + 1;
    pcVar10 = pcVar9 + 3;
    do {
      if (0x19 < (byte)(pcVar10[-3] + 0x9fU)) {
        pcVar10 = pcVar10 + -3;
        goto LAB_00704fe9;
      }
      if (0x19 < (byte)(pcVar10[-2] + 0x9fU)) {
        pcVar10 = pcVar10 + -2;
        goto LAB_00704fe9;
      }
      if (0x19 < (byte)(pcVar10[-1] + 0x9fU)) {
        pcVar10 = pcVar10 + -1;
        goto LAB_00704fe9;
      }
      if (0x19 < (byte)(*pcVar10 + 0x9fU)) goto LAB_00704fe9;
      lVar11 = lVar11 + -1;
      pcVar10 = pcVar10 + 4;
    } while (1 < lVar11);
  }
  lVar11 = (long)pcVar1 - (long)pcVar8;
  if (lVar11 == 1) {
LAB_00704fc6:
    pcVar10 = pcVar8;
    if ((byte)(*pcVar8 + 0x9fU) < 0x1a) {
      pcVar10 = pcVar1;
    }
  }
  else if (lVar11 == 2) {
LAB_00704fb6:
    pcVar10 = pcVar8;
    if ((byte)(*pcVar8 + 0x9fU) < 0x1a) {
      pcVar8 = pcVar8 + 1;
      goto LAB_00704fc6;
    }
  }
  else {
    if (lVar11 != 3) goto LAB_007051e6;
    pcVar10 = pcVar8;
    if ((byte)(*pcVar8 + 0x9fU) < 0x1a) {
      pcVar8 = pcVar8 + 1;
      goto LAB_00704fb6;
    }
  }
LAB_00704fe9:
  if (pcVar10 == pcVar1) goto LAB_007051e6;
  cVar2 = *pcVar9;
  std::__cxx11::string::substr((ulong)&local_58,(ulong)psVar7);
  if ((byte)(cVar2 + 0xbfU) < 0x1a) {
    pcVar1 = local_58 + local_50;
    lVar11 = (long)local_50 >> 2;
    pcVar9 = local_58;
    if (0 < lVar11) {
      pcVar9 = local_58 + (local_50 & 0xfffffffffffffffc);
      lVar12 = lVar11 + 1;
      pcVar8 = local_58 + 3;
      do {
        if (0x19 < (byte)(pcVar8[-3] + 0x9fU)) {
          pcVar8 = pcVar8 + -3;
          goto LAB_00705103;
        }
        if (0x19 < (byte)(pcVar8[-2] + 0x9fU)) {
          pcVar8 = pcVar8 + -2;
          goto LAB_00705103;
        }
        if (0x19 < (byte)(pcVar8[-1] + 0x9fU)) {
          pcVar8 = pcVar8 + -1;
          goto LAB_00705103;
        }
        if (0x19 < (byte)(*pcVar8 + 0x9fU)) goto LAB_00705103;
        lVar12 = lVar12 + -1;
        pcVar8 = pcVar8 + 4;
      } while (1 < lVar12);
    }
    lVar12 = (long)pcVar1 - (long)pcVar9;
    if (lVar12 == 1) {
LAB_007050d9:
      pcVar8 = pcVar9;
      if ((byte)(*pcVar9 + 0x9fU) < 0x1a) {
        pcVar8 = pcVar1;
      }
    }
    else if (lVar12 == 2) {
LAB_007050c9:
      pcVar8 = pcVar9;
      if ((byte)(*pcVar9 + 0x9fU) < 0x1a) {
        pcVar9 = pcVar9 + 1;
        goto LAB_007050d9;
      }
    }
    else {
      bVar5 = true;
      if (lVar12 != 3) goto LAB_007051ce;
      pcVar8 = pcVar9;
      if ((byte)(*pcVar9 + 0x9fU) < 0x1a) {
        pcVar9 = pcVar9 + 1;
        goto LAB_007050c9;
      }
    }
LAB_00705103:
    if (pcVar8 == pcVar1) {
      bVar5 = true;
    }
    else {
      pcVar9 = local_58;
      if (0 < lVar11) {
        pcVar9 = local_58 + (local_50 & 0xfffffffffffffffc);
        lVar11 = lVar11 + 1;
        pcVar8 = local_58 + 3;
        do {
          if (0x19 < (byte)(pcVar8[-3] + 0xbfU)) {
            pcVar8 = pcVar8 + -3;
            goto LAB_007051c7;
          }
          if (0x19 < (byte)(pcVar8[-2] + 0xbfU)) {
            pcVar8 = pcVar8 + -2;
            goto LAB_007051c7;
          }
          if (0x19 < (byte)(pcVar8[-1] + 0xbfU)) {
            pcVar8 = pcVar8 + -1;
            goto LAB_007051c7;
          }
          if (0x19 < (byte)(*pcVar8 + 0xbfU)) goto LAB_007051c7;
          lVar11 = lVar11 + -1;
          pcVar8 = pcVar8 + 4;
        } while (1 < lVar11);
      }
      lVar11 = (long)pcVar1 - (long)pcVar9;
      if (lVar11 == 1) {
LAB_007051a2:
        pcVar8 = pcVar9;
        if ((byte)(*pcVar9 + 0xbfU) < 0x1a) {
          pcVar8 = pcVar1;
        }
      }
      else if (lVar11 == 2) {
LAB_00705195:
        pcVar8 = pcVar9;
        if ((byte)(*pcVar9 + 0xbfU) < 0x1a) {
          pcVar9 = pcVar9 + 1;
          goto LAB_007051a2;
        }
      }
      else {
        pcVar8 = pcVar1;
        if ((lVar11 == 3) && (pcVar8 = pcVar9, (byte)(*pcVar9 + 0xbfU) < 0x1a)) {
          pcVar9 = pcVar9 + 1;
          goto LAB_00705195;
        }
      }
LAB_007051c7:
      bVar5 = pcVar8 == pcVar1;
    }
  }
  else {
    bVar5 = false;
  }
LAB_007051ce:
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (!bVar5) {
    return false;
  }
LAB_007051e6:
  lVar11 = 0;
  local_38 = rhs;
  do {
    if (node->m_isValid == false) {
      this = (InvalidNode *)__cxa_allocate_exception(0x40);
      InvalidNode::InvalidNode(this,&node->m_invalidKey);
      goto LAB_00705366;
    }
    if (node->m_pNode == (node *)0x0) {
      detail::node_data::empty_scalar_abi_cxx11_();
    }
    anon_unknown.dwarf_1b3bc19::tolower((int)&local_58);
    pcVar1 = local_58;
    sVar4 = *(size_t *)((long)&decode::names[0].truename._M_string_length + lVar11);
    if (sVar4 == local_50) {
      if (sVar4 == 0) {
        bVar5 = true;
      }
      else {
        iVar6 = bcmp(*(void **)((long)&decode::names[0].truename._M_dataplus._M_p + lVar11),local_58
                     ,sVar4);
        bVar5 = iVar6 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if (pcVar1 != local_48) {
      operator_delete(pcVar1);
    }
    if (bVar5) {
      bVar5 = true;
LAB_00705314:
      *local_38 = bVar5;
      return true;
    }
    if (node->m_isValid == false) {
      this = (InvalidNode *)__cxa_allocate_exception(0x40);
      InvalidNode::InvalidNode(this,&node->m_invalidKey);
      goto LAB_00705366;
    }
    if (node->m_pNode == (node *)0x0) {
      detail::node_data::empty_scalar_abi_cxx11_();
    }
    anon_unknown.dwarf_1b3bc19::tolower((int)&local_58);
    pcVar1 = local_58;
    sVar4 = *(size_t *)((long)&decode::names[0].falsename._M_string_length + lVar11);
    if (sVar4 == local_50) {
      if (sVar4 == 0) {
        bVar5 = true;
      }
      else {
        iVar6 = bcmp(*(void **)((long)&decode::names[0].falsename._M_dataplus._M_p + lVar11),
                     local_58,sVar4);
        bVar5 = iVar6 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if (pcVar1 != local_48) {
      operator_delete(pcVar1);
    }
    if (bVar5) {
      bVar5 = false;
      goto LAB_00705314;
    }
    lVar11 = lVar11 + 0x40;
    if (lVar11 == 0x100) {
      return false;
    }
  } while( true );
}

Assistant:

bool convert<bool>::decode(const Node& node, bool& rhs) {
  if (!node.IsScalar())
    return false;

  // we can't use iostream bool extraction operators as they don't
  // recognize all possible values in the table below (taken from
  // http://yaml.org/type/bool.html)
  static const struct {
    std::string truename, falsename;
  } names[] = {
      {"y", "n"},
      {"yes", "no"},
      {"true", "false"},
      {"on", "off"},
  };

  if (!IsFlexibleCase(node.Scalar()))
    return false;

  for (const auto& name : names) {
    if (name.truename == tolower(node.Scalar())) {
      rhs = true;
      return true;
    }

    if (name.falsename == tolower(node.Scalar())) {
      rhs = false;
      return true;
    }
  }

  return false;
}